

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_device_buffer.cpp
# Opt level: O3

void __thiscall
gpu::shared_device_buffer_typed<int>::shared_device_buffer_typed
          (shared_device_buffer_typed<int> *this,shared_device_buffer *other)

{
  long *plVar1;
  size_t sVar2;
  
  plVar1 = (long *)other->buffer_;
  (this->super_shared_device_buffer).buffer_ = (uchar *)plVar1;
  (this->super_shared_device_buffer).data_ = other->data_;
  (this->super_shared_device_buffer).type_ = other->type_;
  sVar2 = other->offset_;
  (this->super_shared_device_buffer).size_ = other->size_;
  (this->super_shared_device_buffer).offset_ = sVar2;
  if (plVar1 != (long *)0x0) {
    LOCK();
    *plVar1 = *plVar1 + 1;
    UNLOCK();
  }
  return;
}

Assistant:

shared_device_buffer::shared_device_buffer(const shared_device_buffer &other, size_t offset)
{
	buffer_	= other.buffer_;
	data_	= other.data_;
	type_	= other.type_;
	size_	= other.size_;
	offset_	= other.offset_ + offset;
	incref();
}